

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall chrono::ChMarker::UpdateTime(ChMarker *this,double mytime)

{
  ChQuaternion<double> *pCVar1;
  ChFrameMoving<double> *this_00;
  ChQuaternion<double> *quat;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  Vector motion_axis_versor;
  ChCoordsys<double> local_138;
  ChCoordsys<double> local_f8;
  ChCoordsys<double> local_c0;
  ChQuaternion<double> local_88;
  ChQuaternion<double> local_68;
  ChVector<double> local_40;
  
  local_c0.pos.m_data[2] = 0.0;
  local_138.rot.m_data[0] = 1.0;
  local_c0.rot.m_data[0] = 1.0;
  local_f8.rot.m_data[0] = 1.0;
  local_138.rot.m_data[1] = 0.0;
  local_138.rot.m_data[2] = 0.0;
  local_c0.rot.m_data[1] = 0.0;
  local_c0.rot.m_data[2] = 0.0;
  local_f8.rot.m_data[1] = 0.0;
  local_f8.rot.m_data[2] = 0.0;
  local_138.rot.m_data[3] = 0.0;
  local_c0.rot.m_data[3] = 0.0;
  local_f8.rot.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 0.0;
  (this->super_ChObj).ChTime = mytime;
  if (this->motion_type - M_MOTION_KEYFRAMED < 2) {
    return;
  }
  dVar8 = mytime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  uVar9 = 0;
  dVar6 = mytime;
  local_138.pos.m_data[0] = dVar8;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar7 = mytime;
  local_138.pos.m_data[1] = dVar6;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_138.pos.m_data[2] = dVar7;
  iVar5 = (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[3])();
  if (iVar5 != 8) {
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3._0_8_ = dVar8;
    auVar2._8_8_ = uVar9;
    auVar2._0_8_ = dVar6;
    auVar2 = vunpcklpd_avx(auVar3,auVar2);
    local_138.pos.m_data[0] = auVar2._0_8_ + (this->rest_coord).pos.m_data[0];
    local_138.pos.m_data[1] = auVar2._8_8_ + (this->rest_coord).pos.m_data[1];
    local_138.pos.m_data[2] = dVar7 + (this->rest_coord).pos.m_data[2];
  }
  quat = &local_138.rot;
  dVar7 = mytime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar8 = mytime;
  local_c0.pos.m_data[0] = dVar7;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar7 = mytime;
  local_c0.pos.m_data[1] = dVar8;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar8 = mytime;
  local_c0.pos.m_data[2] = dVar7;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar7 = mytime;
  local_f8.pos.m_data[0] = dVar8;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar8 = mytime;
  local_f8.pos.m_data[1] = dVar7;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  dVar7 = mytime;
  local_f8.pos.m_data[2] = dVar8;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  dVar8 = mytime;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  if (((((dVar7 != 0.0) || (NAN(dVar7))) || (dVar8 != 0.0)) || ((NAN(dVar8) || (mytime != 0.0)))) ||
     (NAN(mytime))) {
    Vnorm<double>(&local_40,&this->motion_axis);
    Q_from_AngAxis(&local_88,dVar7,&local_40);
    local_68.m_data[0] = local_88.m_data[0];
    local_68.m_data[1] = local_88.m_data[1];
    local_68.m_data[2] = local_88.m_data[2];
    local_68.m_data[3] = local_88.m_data[3];
    Qcross(&local_68,&(this->rest_coord).rot);
    local_138.rot.m_data[0] = local_88.m_data[0];
    local_138.rot.m_data[1] = local_88.m_data[1];
    local_138.rot.m_data[2] = local_88.m_data[2];
    local_138.rot.m_data[3] = local_88.m_data[3];
    Qdt_from_AngAxis(&local_88,quat,dVar8,&local_40);
    local_c0.rot.m_data[0] = local_88.m_data[0];
    local_c0.rot.m_data[1] = local_88.m_data[1];
    local_c0.rot.m_data[2] = local_88.m_data[2];
    local_c0.rot.m_data[3] = local_88.m_data[3];
    Qdtdt_from_AngAxis(&local_88,mytime,&local_40,quat,&local_c0.rot);
    local_f8.rot.m_data[0] = local_88.m_data[0];
    local_f8.rot.m_data[1] = local_88.m_data[1];
    local_f8.rot.m_data[2] = local_88.m_data[2];
    local_f8.rot.m_data[3] = local_88.m_data[3];
  }
  else {
    pCVar1 = &(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot;
    if (pCVar1 != quat) {
      local_138.rot.m_data[0] = pCVar1->m_data[0];
      local_138.rot.m_data[1] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
      local_138.rot.m_data[2] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
      local_138.rot.m_data[3] =
           (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    }
    local_c0.rot.m_data[0] = (double)QNULL._0_8_;
    local_c0.rot.m_data[1] = (double)QNULL._8_8_;
    local_c0.rot.m_data[2] = (double)QNULL._16_8_;
    local_c0.rot.m_data[3] = (double)QNULL._24_8_;
    local_f8.rot.m_data[0] = (double)QNULL._0_8_;
    local_f8.rot.m_data[1] = (double)QNULL._8_8_;
    local_f8.rot.m_data[2] = (double)QNULL._16_8_;
    local_f8.rot.m_data[3] = (double)QNULL._24_8_;
  }
  this_00 = &this->super_ChFrameMoving<double>;
  bVar4 = ChCoordsys<double>::operator==
                    (&local_138,&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord);
  if (!bVar4) {
    ChFrame<double>::SetCoord(&this_00->super_ChFrame<double>,&local_138);
  }
  bVar4 = ChCoordsys<double>::operator==(&local_c0,&(this->super_ChFrameMoving<double>).coord_dt);
  if ((!bVar4) ||
     (bVar4 = ChQuaternion<double>::operator==(&local_c0.rot,(ChQuaternion<double> *)QNULL), !bVar4)
     ) {
    (*(this_00->super_ChFrame<double>)._vptr_ChFrame[6])(this_00,&local_c0);
  }
  bVar4 = ChCoordsys<double>::operator==(&local_f8,&(this->super_ChFrameMoving<double>).coord_dtdt);
  if ((bVar4) &&
     (bVar4 = ChQuaternion<double>::operator==(&local_f8.rot,(ChQuaternion<double> *)QNULL), bVar4))
  {
    return;
  }
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[0xb])(this_00,&local_f8);
  return;
}

Assistant:

void ChMarker::UpdateTime(double mytime) {
    Coordsys csys, csys_dt, csys_dtdt;
    Quaternion qtemp;
    double ang, ang_dt, ang_dtdt;

    ChTime = mytime;

    // if a imposed motion (keyframed movement) affects the marker position (example,from R3D animation system),
    // compute the speed and acceleration values by BDF (example,see the UpdatedExternalTime() function, later)
    // so the updating via motion laws can be skipped!
    if (motion_type == M_MOTION_KEYFRAMED)
        return;

    // skip relative-position-functions evaluation also if
    // someone is already handling this from outside..
    if (motion_type == M_MOTION_EXTERNAL)
        return;

    // positions:
    // update positions:    rel_pos
    csys.pos.x() = motion_X->Get_y(mytime);
    csys.pos.y() = motion_Y->Get_y(mytime);
    csys.pos.z() = motion_Z->Get_y(mytime);
    if (motion_X->Get_Type() != ChFunction::FUNCT_MOCAP)
        csys.pos += rest_coord.pos;

    // update speeds:		rel_pos_dt
    csys_dt.pos.x() = motion_X->Get_y_dx(mytime);
    csys_dt.pos.y() = motion_Y->Get_y_dx(mytime);
    csys_dt.pos.z() = motion_Z->Get_y_dx(mytime);

    // update accelerations
    csys_dtdt.pos.x() = motion_X->Get_y_dxdx(mytime);
    csys_dtdt.pos.y() = motion_Y->Get_y_dxdx(mytime);
    csys_dtdt.pos.z() = motion_Z->Get_y_dxdx(mytime);

    // rotations:

    ang = motion_ang->Get_y(mytime);
    ang_dt = motion_ang->Get_y_dx(mytime);
    ang_dtdt = motion_ang->Get_y_dxdx(mytime);

    if ((ang != 0) || (ang_dt != 0) || (ang_dtdt != 0)) {
        // update q
        Vector motion_axis_versor = Vnorm(motion_axis);
        qtemp = Q_from_AngAxis(ang, motion_axis_versor);
        csys.rot = Qcross(qtemp, rest_coord.rot);
        // update q_dt
        csys_dt.rot = chrono::Qdt_from_AngAxis(csys.rot, ang_dt, motion_axis_versor);
        // update q_dtdt
        csys_dtdt.rot = chrono::Qdtdt_from_AngAxis(ang_dtdt, motion_axis_versor, csys.rot, csys_dt.rot);
    } else {
        csys.rot = coord.rot;  // rel_pos.rot;
        csys_dt.rot = QNULL;
        csys_dtdt.rot = QNULL;
    }

    // Set the position, speed and acceleration in relative space,
    // automatically getting also the absolute values,
    if (!(csys == this->coord))
        SetCoord(csys);

    if (!(csys_dt == this->coord_dt) || !(csys_dt.rot == QNULL))
        SetCoord_dt(csys_dt);

    if (!(csys_dtdt == this->coord_dtdt) || !(csys_dtdt.rot == QNULL))
        SetCoord_dtdt(csys_dtdt);
}